

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void comp_mask_pred_line_avx2(__m256i s0,__m256i s1,__m256i a,uint8_t *comp_pred)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i roundA;
  __m256i roundAH;
  __m256i roundAL;
  __m256i blendAH;
  __m256i blendAL;
  __m256i aaAH;
  __m256i ssAH;
  __m256i aaAL;
  __m256i ssAL;
  __m256i ma;
  __m256i round_offset;
  int16_t round_bits;
  __m256i alpha_max;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar2 = vpinsrb_avx(auVar2,0x40,2);
  auVar2 = vpinsrb_avx(auVar2,0x40,3);
  auVar2 = vpinsrb_avx(auVar2,0x40,4);
  auVar2 = vpinsrb_avx(auVar2,0x40,5);
  auVar2 = vpinsrb_avx(auVar2,0x40,6);
  auVar2 = vpinsrb_avx(auVar2,0x40,7);
  auVar2 = vpinsrb_avx(auVar2,0x40,8);
  auVar2 = vpinsrb_avx(auVar2,0x40,9);
  auVar2 = vpinsrb_avx(auVar2,0x40,10);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x40,0xf);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar3 = vpinsrw_avx(auVar3,0x200,2);
  auVar3 = vpinsrw_avx(auVar3,0x200,3);
  auVar3 = vpinsrw_avx(auVar3,0x200,4);
  auVar3 = vpinsrw_avx(auVar3,0x200,5);
  auVar3 = vpinsrw_avx(auVar3,0x200,6);
  auVar3 = vpinsrw_avx(auVar3,0x200,7);
  uStack_1d0 = auVar3._0_8_;
  uStack_1c8 = auVar3._8_8_;
  auVar8._16_8_ = uStack_70;
  auVar8._0_16_ = auVar1;
  auVar8._24_8_ = uStack_68;
  auVar4._8_8_ = in_XMM2_Qb;
  auVar4._0_8_ = in_XMM2_Qa;
  auVar4._16_8_ = in_YMM2_H;
  auVar4._24_8_ = in_register_00001298;
  auVar4 = vpsubb_avx2(auVar8,auVar4);
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar7._16_8_ = in_YMM0_H;
  auVar7._24_8_ = in_register_00001218;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar6._16_8_ = in_YMM1_H;
  auVar6._24_8_ = in_register_00001258;
  auVar7 = vpunpcklbw_avx2(auVar7,auVar6);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar5._16_8_ = in_YMM2_H;
  auVar5._24_8_ = in_register_00001298;
  auVar8 = vpunpcklbw_avx2(auVar5,auVar4);
  auVar11._8_8_ = in_XMM0_Qb;
  auVar11._0_8_ = in_XMM0_Qa;
  auVar11._16_8_ = in_YMM0_H;
  auVar11._24_8_ = in_register_00001218;
  auVar10._8_8_ = in_XMM1_Qb;
  auVar10._0_8_ = in_XMM1_Qa;
  auVar10._16_8_ = in_YMM1_H;
  auVar10._24_8_ = in_register_00001258;
  auVar5 = vpunpckhbw_avx2(auVar11,auVar10);
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = in_XMM2_Qa;
  auVar9._16_8_ = in_YMM2_H;
  auVar9._24_8_ = in_register_00001298;
  auVar6 = vpunpckhbw_avx2(auVar9,auVar4);
  auVar4 = vpmaddubsw_avx2(auVar7,auVar8);
  auVar5 = vpmaddubsw_avx2(auVar5,auVar6);
  auVar13._16_8_ = uStack_1d0;
  auVar13._0_16_ = auVar2;
  auVar13._24_8_ = uStack_1c8;
  auVar4 = vpmulhrsw_avx2(auVar4,auVar13);
  auVar12._16_8_ = uStack_1d0;
  auVar12._0_16_ = auVar2;
  auVar12._24_8_ = uStack_1c8;
  auVar5 = vpmulhrsw_avx2(auVar5,auVar12);
  auVar4 = vpackuswb_avx2(auVar4,auVar5);
  local_5e0 = auVar4._0_8_;
  uStack_5d8 = auVar4._8_8_;
  uStack_5d0 = auVar4._16_8_;
  uStack_5c8 = auVar4._24_8_;
  *in_RDI = local_5e0;
  in_RDI[1] = uStack_5d8;
  in_RDI[2] = uStack_5d0;
  in_RDI[3] = uStack_5c8;
  return;
}

Assistant:

static inline void comp_mask_pred_line_avx2(const __m256i s0, const __m256i s1,
                                            const __m256i a,
                                            uint8_t *comp_pred) {
  const __m256i alpha_max = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const int16_t round_bits = 15 - AOM_BLEND_A64_ROUND_BITS;
  const __m256i round_offset = _mm256_set1_epi16(1 << (round_bits));

  const __m256i ma = _mm256_sub_epi8(alpha_max, a);

  const __m256i ssAL = _mm256_unpacklo_epi8(s0, s1);
  const __m256i aaAL = _mm256_unpacklo_epi8(a, ma);
  const __m256i ssAH = _mm256_unpackhi_epi8(s0, s1);
  const __m256i aaAH = _mm256_unpackhi_epi8(a, ma);

  const __m256i blendAL = _mm256_maddubs_epi16(ssAL, aaAL);
  const __m256i blendAH = _mm256_maddubs_epi16(ssAH, aaAH);
  const __m256i roundAL = _mm256_mulhrs_epi16(blendAL, round_offset);
  const __m256i roundAH = _mm256_mulhrs_epi16(blendAH, round_offset);

  const __m256i roundA = _mm256_packus_epi16(roundAL, roundAH);
  _mm256_storeu_si256((__m256i *)(comp_pred), roundA);
}